

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O0

void vpscatterdd(PDISASM pMyDisasm)

{
  PDISASM pMyDisasm_local;
  
  if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
    if ((pMyDisasm->Reserved_).VEX.pp == '\x01') {
      (pMyDisasm->Instruction).Category = 0x140000;
      if ((pMyDisasm->Reserved_).EVEX.W == '\0') {
        strcpy((pMyDisasm->Instruction).Mnemonic,"vpscatterdd");
        if ((pMyDisasm->Reserved_).VEX.L == '\0') {
          (pMyDisasm->Reserved_).VSIB_ = 4;
          (pMyDisasm->Reserved_).Register_ = 4;
        }
        else if ((pMyDisasm->Reserved_).VEX.L == '\x01') {
          (pMyDisasm->Reserved_).VSIB_ = 8;
          (pMyDisasm->Reserved_).Register_ = 8;
        }
        else if ((pMyDisasm->Reserved_).EVEX.LL == '\x02') {
          (pMyDisasm->Reserved_).VSIB_ = 0x10;
          (pMyDisasm->Reserved_).Register_ = 0x10;
        }
      }
      else {
        strcpy((pMyDisasm->Instruction).Mnemonic,"vpscatterdq");
        if ((pMyDisasm->Reserved_).VEX.L == '\0') {
          (pMyDisasm->Reserved_).VSIB_ = 4;
          (pMyDisasm->Reserved_).Register_ = 4;
        }
        else if ((pMyDisasm->Reserved_).VEX.L == '\x01') {
          (pMyDisasm->Reserved_).VSIB_ = 4;
          (pMyDisasm->Reserved_).Register_ = 8;
        }
        else if ((pMyDisasm->Reserved_).EVEX.LL == '\x02') {
          (pMyDisasm->Reserved_).VSIB_ = 8;
          (pMyDisasm->Reserved_).Register_ = 0x10;
        }
      }
      (pMyDisasm->Reserved_).EVEX.masking = '\x01';
      (pMyDisasm->Reserved_).EVEX.tupletype = '\x06';
      (pMyDisasm->Reserved_).MemDecoration = 3;
      ExGx(pMyDisasm);
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else {
    failDecode(pMyDisasm);
  }
  return;
}

Assistant:

void __bea_callspec__ vpscatterdd(PDISASM pMyDisasm)
{
  if (GV.EVEX.state == InUsePrefix) {
    if (GV.VEX.pp == 1) {
      pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
      if (GV.EVEX.W == 0) {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vpscatterdd");
        #endif
        if (GV.VEX.L == 0) {
          GV.VSIB_ = SSE_REG;
          GV.Register_ = SSE_REG;
        }
        else if (GV.VEX.L == 0x1) {
          GV.VSIB_ = AVX_REG;
          GV.Register_ = AVX_REG;
        }
        else if (GV.EVEX.LL == 0x2) {
          GV.VSIB_ = AVX512_REG;
          GV.Register_ = AVX512_REG;
        }
      }
      else {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vpscatterdq");
        #endif
        if (GV.VEX.L == 0) {
          GV.VSIB_ = SSE_REG;
          GV.Register_ = SSE_REG;
        }
        else if (GV.VEX.L == 0x1) {
          GV.VSIB_ = SSE_REG;
          GV.Register_ = AVX_REG;
        }
        else if (GV.EVEX.LL == 0x2) {
          GV.VSIB_ = AVX_REG;
          GV.Register_ = AVX512_REG;
        }
      }
      GV.EVEX.masking = MERGING;
      GV.EVEX.tupletype = TUPLE1_SCALAR;
      GV.MemDecoration = Arg1dword;
      ExGx(pMyDisasm);
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else {
    failDecode(pMyDisasm);
  }
}